

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectInterfacePerModuleSource.cpp
# Opt level: O1

string * __thiscall
PerModuleInterface::GetOSCanonicalCleanPath_abi_cxx11_
          (string *__return_storage_ptr__,PerModuleInterface *this,char *compilePath_,
          char *filename_)

{
  ulong uVar1;
  Path path_1;
  Path path;
  allocator<char> local_a9;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  ulong local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_80 = (undefined1  [8])&PTR__Path_001198d8;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_78._M_p = (pointer)&local_68;
  strlen((char *)this);
  std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,(ulong)this);
  local_58 = (undefined1  [8])&PTR__Path_001198d8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,compilePath_,&local_a9);
  FileSystemUtils::operator/((Path *)local_a8,(Path *)local_80,(Path *)local_58);
  std::__cxx11::string::_M_assign((string *)&local_78);
  local_a8 = (undefined1  [8])&PTR__Path_001198d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  local_58 = (undefined1  [8])&PTR__Path_001198d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  local_a8 = (undefined1  [8])&PTR__Path_001198d8;
  local_a0._M_p = (pointer)&local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_78._M_p,local_78._M_p + local_70);
  if (local_98 != 0) {
    uVar1 = 0;
    do {
      if (local_a0._M_p[uVar1] == '\\') {
        local_a0._M_p[uVar1] = '/';
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < local_98);
  }
  std::__cxx11::string::_M_assign((string *)&local_78);
  local_a8 = (undefined1  [8])&PTR__Path_001198d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  FileSystemUtils::Path::GetCleanPath((Path *)local_a8,(Path *)local_80);
  std::__cxx11::string::_M_assign((string *)&local_78);
  local_a8 = (undefined1  [8])&PTR__Path_001198d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_78._M_p,local_78._M_p + local_70);
  local_80 = (undefined1  [8])&PTR__Path_001198d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,
                    CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PerModuleInterface::GetOSCanonicalCleanPath( const char* compilePath_, const char* filename_ )
{
	FileSystemUtils::Path path;
	path = compilePath_;
	path = path / filename_;
	path = path.DelimitersToOSDefault();
	path = path.GetCleanPath();
	path.ToOSCanonicalCase();
	return path.m_string;
}